

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

int __thiscall QtMWidgets::TableViewPrivate::init(TableViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  AbstractScrollArea *this_00;
  QWidget *this_01;
  QWidget *pQVar1;
  QVBoxLayout *this_02;
  QSpacerItem *this_03;
  QSpacerItem *spacer;
  QFlags<Qt::WindowType> local_28;
  QSizePolicy sp;
  TableView *q;
  TableViewPrivate *this_local;
  
  this_00 = (AbstractScrollArea *)q_func(this);
  this_01 = (QWidget *)operator_new(0x28);
  pQVar1 = AbstractScrollArea::viewport(this_00);
  QFlags<Qt::WindowType>::QFlags(&local_28);
  QWidget::QWidget(this_01,pQVar1,(QFlags_conflict1 *)(ulong)local_28.i);
  this->widget = this_01;
  QSizePolicy::QSizePolicy((QSizePolicy *)((long)&spacer + 4),Minimum,Minimum,DefaultType);
  QSizePolicy::setHeightForWidth((QSizePolicy *)((long)&spacer + 4),true);
  spacer._0_4_ = spacer._4_4_;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->widget,0));
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,this->widget);
  this->layout = this_02;
  (**(code **)(*(long *)this->layout + 0x68))();
  QLayout::setContentsMargins((int)this->layout,6,6,6);
  this_03 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(this_03,0,0,Minimum,Expanding);
  (**(code **)(*(long *)this->layout + 0x80))(this->layout,this_03);
  QWidget::setBackgroundRole((ColorRole)this_00);
  QWidget::setAutoFillBackground(SUB81(this_00,0));
  ScrollArea::setWidgetResizable((ScrollArea *)this_00,true);
  ScrollArea::setWidget((ScrollArea *)this_00,this->widget);
  return extraout_EAX;
}

Assistant:

void
TableViewPrivate::init()
{
	TableView * q = q_func();

	widget = new QWidget( q->viewport() );
	QSizePolicy sp = QSizePolicy( QSizePolicy::Minimum,
		QSizePolicy::Minimum );
	sp.setHeightForWidth( true );
	widget->setSizePolicy( sp );
	layout = new QVBoxLayout( widget );
	layout->setSpacing( 0 );
	layout->setContentsMargins( 6, 6, 6, 6 );

	QSpacerItem * spacer = new QSpacerItem( 0, 0, QSizePolicy::Minimum,
		QSizePolicy::Expanding );
	layout->addItem( spacer );

	q->setBackgroundRole( QPalette::Midlight );
	q->setAutoFillBackground( true );
	q->setWidgetResizable( true );
	q->setWidget( widget );
}